

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

string * dynamicgraph::toString<double>
                   (string *__return_storage_ptr__,vector<double,_std::allocator<double>_> *v,
                   int precision,int width,string *separator)

{
  pointer pdVar1;
  long lVar2;
  ostream *poVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8;
  long local_1a0 [2];
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (precision < width) {
    uVar6 = 0;
    while( true ) {
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) - 1;
      lVar2 = *(long *)(local_1a8 + -0x18);
      if (uVar5 <= uVar6) break;
      *(uint *)((long)auStack_190 + lVar2) = *(uint *)((long)auStack_190 + lVar2) & 0xfffffefb | 4;
      *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)width;
      *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
      poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar6]);
      std::operator<<(poVar3,(string *)separator);
      uVar6 = uVar6 + 1;
    }
    *(uint *)((long)auStack_190 + lVar2) = *(uint *)((long)auStack_190 + lVar2) & 0xfffffefb | 4;
    *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)width;
    *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
    pdVar4 = pdVar1 + uVar5;
  }
  else {
    uVar6 = 0;
    while( true ) {
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) - 1;
      lVar2 = *(long *)(local_1a8 + -0x18);
      if (uVar5 <= uVar6) break;
      *(uint *)((long)auStack_190 + lVar2) = *(uint *)((long)auStack_190 + lVar2) & 0xfffffefb | 4;
      *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
      poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar6]);
      std::operator<<(poVar3,(string *)separator);
      uVar6 = uVar6 + 1;
    }
    *(uint *)((long)auStack_190 + lVar2) = *(uint *)((long)auStack_190 + lVar2) & 0xfffffefb | 4;
    *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
    pdVar4 = pdVar1 + uVar5;
  }
  std::ostream::_M_insert<double>(*pdVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const std::vector<T> &v, const int precision = 3,
                     const int width = -1, const std::string separator = ", ") {
  std::stringstream ss;
  if (width > precision) {
    for (unsigned int i = 0; i < v.size() - 1; i++)
      ss << std::fixed << std::setw(width) << std::setprecision(precision)
         << v[i] << separator;
    ss << std::fixed << std::setw(width) << std::setprecision(precision)
       << v[v.size() - 1];
  } else {
    for (unsigned int i = 0; i < v.size() - 1; i++)
      ss << std::fixed << std::setprecision(precision) << v[i] << separator;
    ss << std::fixed << std::setprecision(precision) << v[v.size() - 1];
  }

  return ss.str();
}